

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int libssh2_session_method_pref(LIBSSH2_SESSION *session,int method_type,char *prefs)

{
  libssh2_endpoint_data *plVar1;
  int iVar2;
  size_t sVar3;
  LIBSSH2_KEX_METHOD **methodlist;
  char *pcVar4;
  LIBSSH2_COMMON_METHOD *pLVar5;
  size_t sVar6;
  char *pcVar7;
  char *__s;
  int iStack_50;
  char **local_40;
  
  sVar3 = strlen(prefs);
  switch(method_type) {
  case 0:
    local_40 = &session->kex_prefs;
    methodlist = libssh2_kex_methods;
    break;
  case 1:
    local_40 = &session->hostkey_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)libssh2_hostkey_methods();
    break;
  case 2:
    plVar1 = &session->local;
    goto LAB_00113b82;
  case 3:
    plVar1 = &session->remote;
LAB_00113b82:
    local_40 = &plVar1->crypt_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)libssh2_crypt_methods();
    break;
  case 4:
    plVar1 = &session->local;
    goto LAB_00113bae;
  case 5:
    plVar1 = &session->remote;
LAB_00113bae:
    local_40 = &plVar1->mac_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)_libssh2_mac_methods();
    break;
  case 6:
    plVar1 = &session->local;
    goto LAB_00113bc1;
  case 7:
    plVar1 = &session->remote;
LAB_00113bc1:
    local_40 = &plVar1->comp_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)_libssh2_comp_methods(session);
    break;
  case 8:
    local_40 = &(session->local).lang_prefs;
    goto LAB_00113be3;
  case 9:
    local_40 = &(session->remote).lang_prefs;
    goto LAB_00113be3;
  case 10:
    local_40 = &session->sign_algo_prefs;
LAB_00113be3:
    methodlist = (LIBSSH2_KEX_METHOD **)0x0;
    break;
  default:
    pcVar7 = "Invalid parameter specified for method_type";
    iStack_50 = -0x22;
    goto LAB_00113d19;
  }
  pcVar7 = (char *)(*session->alloc)(sVar3 + 1,&session->abstract);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "Error allocated space for method preferences";
    iStack_50 = -6;
  }
  else {
    memcpy(pcVar7,prefs,sVar3 + 1);
    __s = pcVar7;
    while (((__s != (char *)0x0 && (*__s != '\0')) &&
           ((LIBSSH2_CRYPT_METHOD **)methodlist != (LIBSSH2_CRYPT_METHOD **)0x0))) {
      pcVar4 = strchr(__s,0x2c);
      if (pcVar4 == (char *)0x0) {
        sVar3 = strlen(__s);
      }
      else {
        sVar3 = (long)pcVar4 - (long)__s;
      }
      pLVar5 = kex_get_method_by_name(__s,sVar3,(LIBSSH2_COMMON_METHOD **)methodlist);
      if (pLVar5 == (LIBSSH2_COMMON_METHOD *)0x0) {
        if (pcVar4 == (char *)0x0) {
          if (pcVar7 < __s) {
            __s[-1] = '\0';
            __s = __s + -1;
          }
          else {
            *__s = '\0';
          }
        }
        else {
          sVar6 = strlen(__s);
          memmove(__s,pcVar4 + 1,sVar6 - sVar3);
        }
      }
      else {
        __s = pcVar4 + 1;
        if (pcVar4 == (char *)0x0) {
          __s = (char *)0x0;
        }
      }
    }
    if (*pcVar7 != '\0') {
      if (*local_40 != (char *)0x0) {
        (*session->free)(*local_40,&session->abstract);
      }
      *local_40 = pcVar7;
      return 0;
    }
    (*session->free)(pcVar7,&session->abstract);
    pcVar7 = "The requested method(s) are not currently supported";
    iStack_50 = -0x21;
  }
LAB_00113d19:
  iVar2 = _libssh2_error(session,iStack_50,pcVar7);
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_session_method_pref(LIBSSH2_SESSION * session, int method_type,
                            const char *prefs)
{
    char **prefvar, *s, *newprefs;
    size_t prefs_len = strlen(prefs);
    const LIBSSH2_COMMON_METHOD **mlist;

    switch(method_type) {
    case LIBSSH2_METHOD_KEX:
        prefvar = &session->kex_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_kex_methods;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        prefvar = &session->hostkey_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_hostkey_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
        prefvar = &session->local.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_SC:
        prefvar = &session->remote.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_MAC_CS:
        prefvar = &session->local.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_MAC_SC:
        prefvar = &session->remote.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_COMP_CS:
        prefvar = &session->local.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_COMP_SC:
        prefvar = &session->remote.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_LANG_CS:
        prefvar = &session->local.lang_prefs;
        mlist = NULL;
        break;

    case LIBSSH2_METHOD_LANG_SC:
        prefvar = &session->remote.lang_prefs;
        mlist = NULL;
        break;

    case LIBSSH2_METHOD_SIGN_ALGO:
        prefvar = &session->sign_algo_prefs;
        mlist = NULL;
        break;

    default:
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "Invalid parameter specified for method_type");
    }

    s = newprefs = LIBSSH2_ALLOC(session, prefs_len + 1);
    if(!newprefs) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Error allocated space for method preferences");
    }
    memcpy(s, prefs, prefs_len + 1);

    while(s && *s && mlist) {
        char *p = strchr(s, ',');
        size_t method_len = (p ? (size_t)(p - s) : strlen(s));

        if(!kex_get_method_by_name(s, method_len, mlist)) {
            /* Strip out unsupported method */
            if(p) {
                memmove(s, p + 1, strlen(s) - method_len);
            }
            else {
                if(s > newprefs) {
                    *(--s) = '\0';
                }
                else {
                    *s = '\0';
                }
            }
        }
        else {
            s = p ? (p + 1) : NULL;
        }
    }

    if(!*newprefs) {
        LIBSSH2_FREE(session, newprefs);
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "The requested method(s) are not currently "
                              "supported");
    }

    if(*prefvar) {
        LIBSSH2_FREE(session, *prefvar);
    }
    *prefvar = newprefs;

    return 0;
}